

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O0

void test_useless(void)

{
  undefined1 local_58 [8];
  Useless four;
  Useless three;
  undefined1 local_28 [8];
  Useless two;
  Useless one;
  
  L18_1::Useless::Useless((Useless *)&two.pc,10,'x');
  L18_1::Useless::Useless((Useless *)local_28,(Useless *)&two.pc);
  L18_1::Useless::Useless((Useless *)&four.pc,0x14,'o');
  L18_1::Useless::operator+((Useless *)local_58,(Useless *)&two.pc);
  std::operator<<((ostream *)&std::cout,"\nOne: \n");
  L18_1::Useless::showData((Useless *)&two.pc);
  std::operator<<((ostream *)&std::cout,"\nTwo: \n");
  L18_1::Useless::showData((Useless *)local_28);
  std::operator<<((ostream *)&std::cout,"\nThree: \n");
  L18_1::Useless::showData((Useless *)&four.pc);
  std::operator<<((ostream *)&std::cout,"\nFour: \n");
  L18_1::Useless::showData((Useless *)local_58);
  std::operator<<((ostream *)&std::cout,"four = move(one):\n");
  L18_1::Useless::operator=((Useless *)local_58,(Useless *)&two.pc);
  L18_1::Useless::showData((Useless *)local_58);
  L18_1::Useless::operator=((Useless *)local_58,(Useless *)&two.pc);
  L18_1::Useless::showData((Useless *)local_58);
  L18_1::Useless::~Useless((Useless *)local_58);
  L18_1::Useless::~Useless((Useless *)&four.pc);
  L18_1::Useless::~Useless((Useless *)local_28);
  L18_1::Useless::~Useless((Useless *)&two.pc);
  return;
}

Assistant:

void test_useless() {
    using namespace L18_1;
//    using namespace std;

    //  10 x 'x'
    Useless one(10, 'x');
    Useless two = one;  //  calls 'copy constructor'
    Useless three(20, 'o');
    //  first, '+'
    //  then, 'copy constructor?'
    //  the mingw compiler doesn't call 'move constructor', but still transfer ownership of 'temp'...
    Useless four(one + three);

    cout << "\nOne: \n";
    one.showData();
    cout << "\nTwo: \n";
    two.showData();
    cout << "\nThree: \n";
    three.showData();
    cout << "\nFour: \n";
    four.showData();

    //  use std::move
    cout << "four = move(one):\n";
    //  this will call 'copy assignment'
    four = one;
    four.showData();
    //  this will call 'move assignment'
    //  std::move make left-value(one) into right-value
    four = std::move(one);
    four.showData();
}